

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_store_halfword.c
# Opt level: O1

void load_store_byte_halfword(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  byte bVar2;
  uint16_t uVar3;
  uint uVar4;
  int old;
  uint32_t v;
  
  uVar1 = thminstr->raw;
  uVar4 = *(int *)((long)state->r + (ulong)(uVar1 >> 4 & 0x1c)) +
          *(int *)((long)state->r + (ulong)(uVar1 >> 1 & 0x1c));
  if ((uVar1 & 0xc00) == 0) {
    (*state->write_half)(uVar4,(uint16_t)state->r[uVar1 & 7],ACCESS_NONSEQUENTIAL);
    return;
  }
  if ((uVar1 >> 0xb & 1) == 0) {
LAB_0010ec8b:
    bVar2 = (*state->read_byte)(uVar4,ACCESS_NONSEQUENTIAL);
    v = (uint32_t)bVar2;
    old = 8;
  }
  else {
    if ((uVar1 >> 10 & 1) == 0) {
      uVar3 = (*state->read_half)(uVar4,ACCESS_NONSEQUENTIAL);
      uVar4 = arm_ror((status_register_t *)0x0,(uint)uVar3,(uVar4 & 1) << 3);
      goto LAB_0010ece3;
    }
    if ((uVar4 & 1) != 0) goto LAB_0010ec8b;
    uVar3 = (*state->read_half)(uVar4,ACCESS_NONSEQUENTIAL);
    v = (uint32_t)uVar3;
    old = 0x10;
  }
  uVar4 = sign_extend_word(v,old,0x20);
LAB_0010ece3:
  (*state->cpu_idle)(1);
  uVar1 = thminstr->raw;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)(uVar1 & 7),(ulong)uVar4);
  }
  state->r[uVar1 & 7] = uVar4;
  return;
}

Assistant:

void load_store_byte_halfword(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    load_store_byte_halfword_t* instr = &thminstr->LOAD_STORE_BYTE_HALFWORD;
    word address = get_register(state, instr->rb) + get_register(state, instr->ro);
    if (instr->s == 0 && instr->h == 0) {
        half rddata = get_register(state, instr->rd) & 0xFFFF;
        state->write_half(address, rddata, ACCESS_NONSEQUENTIAL);
    } else {
        word value;
        if (instr->h) {
            if (instr->s) {
                if (address & 1) {
                    value = state->read_byte(address, ACCESS_NONSEQUENTIAL);
                    value = sign_extend_word(value, 8, 32);
                    state->cpu_idle(1);
                } else {
                    value = state->read_half(address, ACCESS_NONSEQUENTIAL);
                    value = sign_extend_word(value, 16, 32);
                    state->cpu_idle(1);
                }
            } else {
                value = state->read_half(address, ACCESS_NONSEQUENTIAL);
                value = arm_ror(NULL, value, (address & 0x1) << 3);
                state->cpu_idle(1);
            }
        } else {
            value = state->read_byte(address, ACCESS_NONSEQUENTIAL);
            value = sign_extend_word(value, 8, 32);
            state->cpu_idle(1);
        }

        set_register(state, instr->rd, value);
    }
}